

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

print * __thiscall
lest::for_test<lest::print>(lest *this,tests *specification,texts *in,print *perform,int n)

{
  long *plVar1;
  int iVar2;
  ostream *poVar3;
  bool bVar4;
  int iVar5;
  fd_set *__exceptfds;
  int iVar6;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  long *plVar7;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  char *local_88;
  long local_80;
  char local_78 [16];
  _Any_data local_68;
  code *local_58;
  
  iVar5 = (int)perform;
  __exceptfds = (fd_set *)CONCAT71((int7)((ulong)perform >> 8),iVar5 < 1);
  if (iVar5 == -1 || iVar5 >= 1) {
    iVar6 = 0;
    do {
      plVar1 = *(long **)(this + 8);
      for (plVar7 = *(long **)this; plVar7 != plVar1; plVar7 = plVar7 + 8) {
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char*>((string *)local_a8,*plVar7,plVar7[1] + *plVar7);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffb8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)specification);
        iVar2 = select((int)(string *)local_a8,(fd_set *)&stack0xffffffffffffffb8,__writefds,
                       __exceptfds,(timeval *)CONCAT44(in_register_00000084,n));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffffb8);
        if (local_a8[0] != local_98) {
          operator_delete(local_a8[0]);
        }
        if ((char)iVar2 != '\0') {
          local_88 = local_78;
          std::__cxx11::string::_M_construct<char*>((string *)&local_88,*plVar7,plVar7[1] + *plVar7)
          ;
          std::function<void_(lest::env_&)>::function
                    ((function<void_(lest::env_&)> *)&local_68,
                     (function<void_(lest::env_&)> *)(plVar7 + 4));
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)
                              (in->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,local_88,local_80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
          if (local_58 != (code *)0x0) {
            (*local_58)(&local_68,&local_68,__destroy_functor);
          }
          if (local_88 != local_78) {
            operator_delete(local_88);
          }
        }
      }
      iVar6 = iVar6 + 1;
      bVar4 = iVar6 < iVar5 || iVar5 == -1;
      __exceptfds = (fd_set *)(ulong)CONCAT31((int3)((ulong)perform >> 8),bVar4);
    } while (bVar4);
  }
  return (print *)in;
}

Assistant:

Action && for_test( tests specification, texts in, Action && perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( auto & testing : specification )
        {
            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return std::move( perform );
        }
    }
    return std::move( perform );
}